

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O0

Vec_Ptr_t * Vec_PtrAllocSimInfo(int nEntries,int nWords)

{
  void **pArray;
  Vec_Ptr_t *pVVar1;
  int local_24;
  int i;
  uint *pInfo;
  void **pMemory;
  int nWords_local;
  int nEntries_local;
  
  pArray = (void **)malloc(((long)nWords * 4 + 8) * (long)nEntries);
  for (local_24 = 0; local_24 < nEntries; local_24 = local_24 + 1) {
    pArray[local_24] = (void *)((long)pArray + (long)(local_24 * nWords) * 4 + (long)nEntries * 8);
  }
  pVVar1 = Vec_PtrAllocArray(pArray,nEntries);
  return pVVar1;
}

Assistant:

static inline Vec_Ptr_t * Vec_PtrAllocSimInfo( int nEntries, int nWords )
{
    void ** pMemory;
    unsigned * pInfo;
    int i;
    pMemory = (void **)ABC_ALLOC( char, (sizeof(void *) + sizeof(unsigned) * (size_t)nWords) * nEntries );
    pInfo = (unsigned *)(pMemory + nEntries);
    for ( i = 0; i < nEntries; i++ )
        pMemory[i] = pInfo + i * nWords;
    return Vec_PtrAllocArray( pMemory, nEntries );
}